

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O1

GainedMove __thiscall GainContainer::getBestMove(GainContainer *this,uint max_diff)

{
  uint uVar1;
  uint uVar2;
  GainBuckets *this_00;
  int iVar3;
  int iVar4;
  GainedCell GVar5;
  GainedCell GVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  GainedMove GVar13;
  
  this_00 = (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar1 = this_00->num_elems_;
  uVar2 = this_00[1].num_elems_;
  uVar7 = uVar1 - uVar2;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  if (uVar9 < max_diff) {
    GVar5 = GainBuckets::getMaxGainedCell(this_00);
    GVar6 = GainBuckets::getMaxGainedCell
                      ((this->buckets_).
                       super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
    iVar10 = GVar5.second;
    iVar4 = GVar6.second;
    bVar12 = SBORROW4(iVar10,iVar4);
    iVar3 = iVar10 - iVar4;
    bVar11 = iVar10 == iVar4;
  }
  else {
    bVar12 = SBORROW4(uVar1,uVar2);
    iVar3 = uVar1 - uVar2;
    bVar11 = uVar1 == uVar2;
  }
  bVar12 = bVar12 != iVar3 < 0;
  GVar5 = GainBuckets::getMaxGainedCell
                    ((GainBuckets *)
                     ((long)&(((this->buckets_).
                               super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl
                               .super__Vector_impl_data._M_start)->container_).
                             super__Vector_base<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl + (ulong)((uint)(bVar11 || bVar12) * 0x28)));
  uVar8 = 0x10000000000;
  if (bVar11 || bVar12) {
    uVar8 = 0x100000000;
  }
  GVar13.first = (Move)((ulong)GVar5 & 0xffffffff | uVar8);
  GVar13.second = GVar5.second;
  return GVar13;
}

Assistant:

GainContainer::GainedMove GainContainer::getBestMove(unsigned max_diff) const {
  PartId from_part;
  int FstPartElems = buckets_[0].getNumElems(),
      SndPartElems = buckets_[1].getNumElems();
  if (std::abs(FstPartElems - SndPartElems) < max_diff)
    from_part = buckets_[0].getMaxGainedCell().second >
                buckets_[1].getMaxGainedCell().second ?
                0 : 1;
  else if (FstPartElems > SndPartElems)
    from_part = 0;
  else if (FstPartElems < SndPartElems)
    from_part = 1;
  auto [cell, gain] = buckets_[from_part].getMaxGainedCell();
  return GainedMove{{cell, from_part, OppositePart(from_part)}, gain};
}